

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O0

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinB3LYP,void>::
eval_exc_vxc_inc_<double&,int&,double_const*&,double_const*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinB3LYP,_void> *this,double *args,int *args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6)

{
  bool bVar1;
  host_buffer_type in_RCX;
  host_buffer_type in_RDX;
  host_buffer_type in_RSI;
  BuiltinKernel *in_RDI;
  const_host_buffer_type unaff_retaddr;
  const_host_buffer_type in_stack_00000038;
  double in_stack_00000050;
  
  bVar1 = BuiltinKernel::is_polarized(in_RDI);
  if (bVar1) {
    host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinB3LYP>
              (in_stack_00000050,args_6._4_4_,(const_host_buffer_type)args_5,in_stack_00000038,
               (host_buffer_type)this,args,(host_buffer_type)args_1);
  }
  else {
    host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinB3LYP>
              ((double)args_3,args_4._4_4_,unaff_retaddr,(const_host_buffer_type)in_RDI,in_RSI,
               in_RDX,in_RCX);
  }
  return;
}

Assistant:

void eval_exc_vxc_inc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_inc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_inc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }